

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_tpl_auto_escape.cc
# Opt level: O1

void LogPrintf(int severity,char *pat,...)

{
  char in_AL;
  undefined8 *puVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if ((severity != 0) || (FLAG_verbose == '\x01')) {
    local_b8 = in_RDX;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    if (severity == 4) {
      LogPrintf();
    }
    if (severity == 0) {
      fwrite("[VERBOSE] ",10,1,_stdout);
    }
    local_d8 = local_c8;
    local_e0 = &ap[0].overflow_arg_area;
    local_e8 = 0x3000000010;
    if ((uint)severity < 2) {
      puVar1 = (undefined8 *)&stdout;
    }
    else {
      puVar1 = (undefined8 *)&stderr;
    }
    vfprintf((FILE *)*puVar1,pat,&local_e8);
    if (severity == 4) {
      exit(1);
    }
  }
  return;
}

Assistant:

static void LogPrintf(int severity, const char* pat, ...) {
  if (severity == LOG_VERBOSE && !FLAG_verbose)
    return;
  if (severity == LOG_FATAL)
    fprintf(stderr, "FATAL ERROR: ");
  if (severity == LOG_VERBOSE)
    fprintf(stdout, "[VERBOSE] ");
  va_list ap;
  va_start(ap, pat);
  vfprintf(severity == LOG_INFO || severity == LOG_VERBOSE ? stdout: stderr,
           pat, ap);
  va_end(ap);
  if (severity == LOG_FATAL)
    exit(1);
}